

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsettings.cpp
# Opt level: O2

bool __thiscall
QConfFileSettingsPrivate::readIniLine
          (QConfFileSettingsPrivate *this,QByteArrayView data,qsizetype *dataPos,
          qsizetype *lineStart,qsizetype *lineLen,qsizetype *equalsPos)

{
  byte bVar1;
  char cVar2;
  char cVar3;
  bool bVar4;
  QConfFileSettingsPrivate *pQVar5;
  long lVar6;
  QConfFileSettingsPrivate *pQVar7;
  long lVar8;
  byte *pbVar9;
  
  lVar6 = data.m_size;
  *lineLen = -1;
  pQVar5 = *(QConfFileSettingsPrivate **)data.m_data;
  while ((*dataPos = (qsizetype)pQVar5, (long)pQVar5 < (long)this &&
         ((SettingsImpl::charTraits
           [*(byte *)((long)&(pQVar5->super_QSettingsPrivate).super_QObjectPrivate.super_QObjectData
                             ._vptr_QObjectData + lVar6)] & 1) != 0))) {
    pQVar5 = (QConfFileSettingsPrivate *)
             ((long)&(pQVar5->super_QSettingsPrivate).super_QObjectPrivate.super_QObjectData.
                     _vptr_QObjectData + 1);
  }
  bVar4 = false;
  do {
    while( true ) {
      pQVar7 = pQVar5;
      if ((long)this <= (long)pQVar5) goto LAB_003d9eda;
      pbVar9 = (byte *)((long)&(pQVar5->super_QSettingsPrivate).super_QObjectPrivate.
                               super_QObjectData._vptr_QObjectData + lVar6 + 1);
      while (pQVar7 = pQVar5,
            bVar1 = *(byte *)((long)&(pQVar7->super_QSettingsPrivate).super_QObjectPrivate.
                                     super_QObjectData._vptr_QObjectData + lVar6),
            (SettingsImpl::charTraits[bVar1] & 2) == 0) {
        pQVar5 = (QConfFileSettingsPrivate *)
                 ((long)&(pQVar7->super_QSettingsPrivate).super_QObjectPrivate.super_QObjectData.
                         _vptr_QObjectData + 1);
        pbVar9 = pbVar9 + 1;
        pQVar7 = this;
        if (this == pQVar5) goto LAB_003d9eda;
      }
      pQVar5 = (QConfFileSettingsPrivate *)
               ((long)&(pQVar7->super_QSettingsPrivate).super_QObjectPrivate.super_QObjectData.
                       _vptr_QObjectData + 1);
      if ((bVar1 == 10) || (bVar1 == 0xd)) break;
      if (bVar1 == 0x22) {
        bVar4 = (bool)(bVar4 ^ 1);
      }
      else if (bVar1 == 0x5c) {
        if (((long)pQVar5 < (long)this) &&
           (pQVar5 = (QConfFileSettingsPrivate *)
                     ((long)&(pQVar7->super_QSettingsPrivate).super_QObjectPrivate.super_QObjectData
                             ._vptr_QObjectData + 2), (long)pQVar5 < (long)this)) {
          cVar3 = *(char *)((long)&(pQVar7->super_QSettingsPrivate).super_QObjectPrivate.
                                   super_QObjectData._vptr_QObjectData + lVar6 + 1);
          cVar2 = *(char *)((long)&(pQVar7->super_QSettingsPrivate).super_QObjectPrivate.
                                   super_QObjectData._vptr_QObjectData + lVar6 + 2);
          if ((cVar2 == '\r' && cVar3 == '\n') || (cVar2 == '\n' && cVar3 == '\r')) {
            pQVar5 = (QConfFileSettingsPrivate *)
                     ((long)&(pQVar7->super_QSettingsPrivate).super_QObjectPrivate.super_QObjectData
                             ._vptr_QObjectData + 3);
          }
        }
      }
      else if (bVar1 == 0x3d) {
        if ((!bVar4) && (*lineLen == -1)) {
          *lineLen = (qsizetype)pQVar7;
        }
      }
      else {
        if ((QConfFileSettingsPrivate *)*dataPos != pQVar7) goto LAB_003d9ecb;
        while ((((long)pQVar5 < (long)this &&
                (cVar3 = *(char *)((long)&(pQVar5->super_QSettingsPrivate).super_QObjectPrivate.
                                          super_QObjectData._vptr_QObjectData + lVar6),
                cVar3 != '\n')) && (cVar3 != '\r'))) {
          pQVar5 = (QConfFileSettingsPrivate *)
                   ((long)&(pQVar5->super_QSettingsPrivate).super_QObjectPrivate.super_QObjectData.
                           _vptr_QObjectData + 1);
          pbVar9 = pbVar9 + 1;
        }
        while (((long)pQVar5 < (long)this && ((SettingsImpl::charTraits[*pbVar9] & 1) != 0))) {
          pQVar5 = (QConfFileSettingsPrivate *)
                   ((long)&(pQVar5->super_QSettingsPrivate).super_QObjectPrivate.super_QObjectData.
                           _vptr_QObjectData + 1);
          pbVar9 = pbVar9 + 1;
        }
LAB_003d9e36:
        *dataPos = (qsizetype)pQVar5;
      }
    }
    if ((QConfFileSettingsPrivate *)*dataPos == pQVar7) goto LAB_003d9e36;
LAB_003d9ecb:
  } while (bVar4);
LAB_003d9eda:
  *(QConfFileSettingsPrivate **)data.m_data = pQVar7;
  lVar6 = *dataPos;
  lVar8 = (long)pQVar7 - lVar6;
  *lineStart = lVar8;
  return lVar8 != 0 && lVar6 <= (long)pQVar7;
}

Assistant:

bool QConfFileSettingsPrivate::readIniLine(QByteArrayView data, qsizetype &dataPos,
                                           qsizetype &lineStart, qsizetype &lineLen,
                                           qsizetype &equalsPos)
{
    constexpr auto Space = SettingsImpl::Space;
    constexpr auto Special = SettingsImpl::Special;
    qsizetype dataLen = data.size();
    bool inQuotes = false;

    equalsPos = -1;

    lineStart = dataPos;
    while (lineStart < dataLen && (charTraits[uint(uchar(data.at(lineStart)))] & Space))
        ++lineStart;

    qsizetype i = lineStart;
    while (i < dataLen) {
        char ch = data.at(i);
        while (!(charTraits[uchar(ch)] & Special)) {
            if (++i == dataLen)
                goto break_out_of_outer_loop;
            ch = data.at(i);
        }

        ++i;
        if (ch == '=') {
            if (!inQuotes && equalsPos == -1)
                equalsPos = i - 1;
        } else if (ch == '\n' || ch == '\r') {
            if (i == lineStart + 1) {
                ++lineStart;
            } else if (!inQuotes) {
                --i;
                goto break_out_of_outer_loop;
            }
        } else if (ch == '\\') {
            if (i < dataLen) {
                char ch = data.at(i++);
                if (i < dataLen) {
                    char ch2 = data.at(i);
                    // \n, \r, \r\n, and \n\r are legitimate line terminators in INI files
                    if ((ch == '\n' && ch2 == '\r') || (ch == '\r' && ch2 == '\n'))
                        ++i;
                }
            }
        } else if (ch == '"') {
            inQuotes = !inQuotes;
        } else {
            Q_ASSERT(ch == ';');

            if (i == lineStart + 1) {
                while (i < dataLen && (((ch = data.at(i)) != '\n') && ch != '\r'))
                    ++i;
                while (i < dataLen && charTraits[uchar(data.at(i))] & Space)
                    ++i;
                lineStart = i;
            } else if (!inQuotes) {
                --i;
                goto break_out_of_outer_loop;
            }
        }
    }

break_out_of_outer_loop:
    dataPos = i;
    lineLen = i - lineStart;
    return lineLen > 0;
}